

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::SuperClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  char *****pppppcVar1;
  undefined8 uVar2;
  long lVar3;
  FileOptions_OptimizeMode FVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  char ******ppppppcVar8;
  char ******ppppppcVar9;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_1;
  char *****local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined5 uStack_9f;
  undefined2 uStack_9a;
  undefined6 uStack_98;
  undefined1 uStack_92;
  undefined1 uStack_91;
  char *****local_90;
  char *****local_88;
  char *****local_80;
  undefined8 uStack_78;
  char *****local_70;
  char *****local_68;
  char *****local_60;
  undefined8 uStack_58;
  char ****local_50;
  char *****local_48;
  char ****local_40;
  char ****local_38 [2];
  
  FVar4 = GetOptimizeFor(*(FileDescriptor **)(this + 0x10),(Options *)descriptor,(bool *)0x0);
  if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    local_70 = (char *****)0x15;
    local_90 = (char *****)&local_80;
    local_90 = (char *****)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_70);
    local_80 = local_70;
    *local_90 = (char ****)0x4655424f544f5250;
    ((char ******)local_90)[1] = (char *****)0x415053454d414e5f;
    builtin_strncpy((char *)((long)local_90 + 0xd),"SPACE_ID",8);
    local_88 = local_70;
    *(char *)((long)local_90 + (long)local_70) = '\0';
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x40eef8);
    ppppppcVar8 = (char ******)(puVar5 + 2);
    if ((char ******)*puVar5 == ppppppcVar8) {
      pppppcVar1 = *ppppppcVar8;
      uVar2 = puVar5[3];
      local_a0 = SUB81(pppppcVar1,0);
      uStack_9f = (undefined5)((ulong)pppppcVar1 >> 8);
      uStack_9a = (undefined2)((ulong)pppppcVar1 >> 0x30);
      uStack_98 = (undefined6)uVar2;
      uStack_92 = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_91 = (undefined1)((ulong)uVar2 >> 0x38);
      local_b0 = (char *****)&local_a0;
    }
    else {
      pppppcVar1 = *ppppppcVar8;
      local_a0 = SUB81(pppppcVar1,0);
      uStack_9f = (undefined5)((ulong)pppppcVar1 >> 8);
      uStack_9a = (undefined2)((ulong)pppppcVar1 >> 0x30);
      local_b0 = (char *****)*puVar5;
    }
    local_a8 = puVar5[1];
    *puVar5 = ppppppcVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_b0 != (char *****)&local_a0) {
      operator_delete(local_b0);
    }
    ppppppcVar8 = (char ******)local_90;
    if ((char ******)local_90 == &local_80) {
      return __return_storage_ptr__;
    }
  }
  else {
    FVar4 = GetOptimizeFor(*(FileDescriptor **)(this + 0x10),(Options *)descriptor,(bool *)0x0);
    local_b0 = (char *****)&local_a0;
    if (((FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(this + 0x78) != 0)) ||
       (*(int *)(this + 4) != 0)) {
      local_a8 = 0;
      local_a0 = 0;
      ppppppcVar8 = &local_60;
      local_48 = (char *****)0x15;
      local_70 = (char *****)ppppppcVar8;
      local_70 = (char *****)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_48);
      local_60 = local_48;
      *local_70 = (char ****)0x4655424f544f5250;
      ((char ******)local_70)[1] = (char *****)0x415053454d414e5f;
      builtin_strncpy((char *)((long)local_70 + 0xd),"SPACE_ID",8);
      local_68 = local_48;
      *(char *)((long)local_70 + (long)local_48) = '\0';
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x40eef8);
      ppppppcVar9 = (char ******)(puVar5 + 2);
      if ((char ******)*puVar5 == ppppppcVar9) {
        local_80 = *ppppppcVar9;
        uStack_78 = puVar5[3];
        local_90 = (char *****)&local_80;
      }
      else {
        local_80 = *ppppppcVar9;
        local_90 = (char *****)*puVar5;
      }
      local_88 = (char *****)puVar5[1];
      *puVar5 = ppppppcVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar7) {
        lVar3 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ppppppcVar9 = (char ******)local_70;
      if ((char ******)local_90 != &local_80) {
        operator_delete(local_90);
        ppppppcVar9 = (char ******)local_70;
      }
    }
    else {
      uStack_98 = 0x657361427364;
      local_a0 = 0x5a;
      uStack_9f = 0x69466f7265;
      uStack_9a = 0x6c65;
      local_a8 = 0xe;
      uStack_92 = 0;
      ppppppcVar8 = (char ******)local_38;
      local_50 = (char ****)0x15;
      local_48 = (char *****)ppppppcVar8;
      local_48 = (char *****)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
      local_38[0] = local_50;
      *local_48 = (char ****)0x4655424f544f5250;
      ((char ******)local_48)[1] = (char *****)0x415053454d414e5f;
      builtin_strncpy((char *)((long)local_48 + 0xd),"SPACE_ID",8);
      local_40 = local_50;
      *(char *)((long)local_48 + (long)local_50) = '\0';
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x40eef8);
      ppppppcVar9 = (char ******)(puVar5 + 2);
      if ((char ******)*puVar5 == ppppppcVar9) {
        local_60 = *ppppppcVar9;
        uStack_58 = puVar5[3];
        local_70 = (char *****)&local_60;
      }
      else {
        local_60 = *ppppppcVar9;
        local_70 = (char *****)*puVar5;
      }
      local_68 = (char *****)puVar5[1];
      *puVar5 = ppppppcVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      ppppppcVar9 = (char ******)(puVar5 + 2);
      if ((char ******)*puVar5 == ppppppcVar9) {
        local_80 = *ppppppcVar9;
        uStack_78 = puVar5[3];
        local_90 = (char *****)&local_80;
      }
      else {
        local_80 = *ppppppcVar9;
        local_90 = (char *****)*puVar5;
      }
      local_88 = (char *****)puVar5[1];
      *puVar5 = ppppppcVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar7) {
        lVar3 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((char ******)local_90 != &local_80) {
        operator_delete(local_90);
      }
      ppppppcVar9 = (char ******)local_48;
      if ((char ******)local_70 != &local_60) {
        operator_delete(local_70);
        ppppppcVar9 = (char ******)local_48;
      }
    }
    if (ppppppcVar9 != ppppppcVar8) {
      operator_delete(ppppppcVar9);
    }
    ppppppcVar8 = (char ******)local_b0;
    if (local_b0 == (char *****)&local_a0) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(ppppppcVar8);
  return __return_storage_ptr__;
}

Assistant:

std::string SuperClassName(const Descriptor* descriptor,
                           const Options& options) {
  if (!HasDescriptorMethods(descriptor->file(), options)) {
    return "::" + ProtobufNamespace(options) + "::MessageLite";
  }
  auto simple_base = SimpleBaseClass(descriptor, options);
  if (simple_base.empty()) {
    return "::" + ProtobufNamespace(options) + "::Message";
  }
  return "::" + ProtobufNamespace(options) + "::internal::" + simple_base;
}